

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picojson.h
# Opt level: O2

void __thiscall
picojson::
serialize_str_char<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::operator()(serialize_str_char<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *this,char c)

{
  int iVar1;
  undefined7 in_register_00000031;
  allocator<char> local_31;
  char buf [7];
  
  iVar1 = (int)CONCAT71(in_register_00000031,c);
  switch(iVar1) {
  case 8:
    std::__cxx11::string::string<std::allocator<char>>((string *)buf,"\\b",&local_31);
    copy<std::back_insert_iterator<std::__cxx11::string>>((string *)buf,(this->oi).container);
    break;
  case 9:
    std::__cxx11::string::string<std::allocator<char>>((string *)buf,"\\t",&local_31);
    copy<std::back_insert_iterator<std::__cxx11::string>>((string *)buf,(this->oi).container);
    break;
  case 10:
    std::__cxx11::string::string<std::allocator<char>>((string *)buf,"\\n",&local_31);
    copy<std::back_insert_iterator<std::__cxx11::string>>((string *)buf,(this->oi).container);
    break;
  case 0xb:
switchD_0010b372_caseD_b:
    if ((byte)c < 0x20 || c == '\x7f') {
      snprintf(buf,7,"\\u%04x",(ulong)(byte)c);
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<char*,std::back_insert_iterator<std::__cxx11::string>>
                (buf,buf + 6,(this->oi).container);
      return;
    }
    std::__cxx11::string::push_back((char)(this->oi).container);
    return;
  case 0xc:
    std::__cxx11::string::string<std::allocator<char>>((string *)buf,"\\f",&local_31);
    copy<std::back_insert_iterator<std::__cxx11::string>>((string *)buf,(this->oi).container);
    break;
  case 0xd:
    std::__cxx11::string::string<std::allocator<char>>((string *)buf,"\\r",&local_31);
    copy<std::back_insert_iterator<std::__cxx11::string>>((string *)buf,(this->oi).container);
    break;
  default:
    if (iVar1 == 0x5c) {
      std::__cxx11::string::string<std::allocator<char>>((string *)buf,"\\\\",&local_31);
      copy<std::back_insert_iterator<std::__cxx11::string>>((string *)buf,(this->oi).container);
    }
    else if (iVar1 == 0x2f) {
      std::__cxx11::string::string<std::allocator<char>>((string *)buf,"\\/",&local_31);
      copy<std::back_insert_iterator<std::__cxx11::string>>((string *)buf,(this->oi).container);
    }
    else {
      if (iVar1 != 0x22) goto switchD_0010b372_caseD_b;
      std::__cxx11::string::string<std::allocator<char>>((string *)buf,"\\\"",&local_31);
      copy<std::back_insert_iterator<std::__cxx11::string>>((string *)buf,(this->oi).container);
    }
  }
  std::__cxx11::string::~string((string *)buf);
  return;
}

Assistant:

void operator()(char c) {
    switch (c) {
#define MAP(val, sym)                                                                                                              \
  case val:                                                                                                                        \
    copy(sym, oi);                                                                                                                 \
    break
      MAP('"', "\\\"");
      MAP('\\', "\\\\");
      MAP('/', "\\/");
      MAP('\b', "\\b");
      MAP('\f', "\\f");
      MAP('\n', "\\n");
      MAP('\r', "\\r");
      MAP('\t', "\\t");
#undef MAP
    default:
      if (static_cast<unsigned char>(c) < 0x20 || c == 0x7f) {
        char buf[7];
        SNPRINTF(buf, sizeof(buf), "\\u%04x", c & 0xff);
        copy(buf, buf + 6, oi);
      } else {
        *oi++ = c;
      }
      break;
    }
  }